

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CCallSimplifierVisitor.cpp
# Opt level: O0

void __thiscall
IRT::CCallSimplifierVisitor::Visit(CCallSimplifierVisitor *this,CTempExpression *expression)

{
  unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> local_20;
  CTempExpression *local_18;
  CTempExpression *expression_local;
  CCallSimplifierVisitor *this_local;
  
  local_18 = expression;
  expression_local = (CTempExpression *)this;
  (*(expression->super_CExpression).super_IExpression.super_INode._vptr_INode[3])(&local_20);
  std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::operator=
            (&this->childExpression,&local_20);
  std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::~unique_ptr
            (&local_20);
  return;
}

Assistant:

void IRT::CCallSimplifierVisitor::Visit(const CTempExpression &expression) {
    childExpression = std::move(expression.Copy());
}